

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O3

Mtbdd __thiscall sylvan::Mtbdd::MtbddStrictThreshold(Mtbdd *this,double value)

{
  MTBDD *in_RSI;
  undefined1 local_50 [64];
  
  local_50._16_8_ = *in_RSI;
  local_50._0_8_ = mtbdd_strict_threshold_double_WRAP;
  local_50._8_8_ = (__pointer_type)0x1;
  local_50._24_8_ = value;
  lace_run_task((Task *)local_50);
  this->mtbdd = local_50._16_8_;
  mtbdd_protect(&this->mtbdd);
  return (Mtbdd)(MTBDD)this;
}

Assistant:

Mtbdd
Mtbdd::MtbddStrictThreshold(double value) const
{
    return mtbdd_strict_threshold_double(mtbdd, value);
}